

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

void __thiscall ON_wString::SetAt(ON_wString *this,int i,char c)

{
  ON_Internal_Empty_wString *pOVar1;
  
  if (-1 < i) {
    pOVar1 = &empty_wstring;
    if (this->m_s != (wchar_t *)0x0) {
      pOVar1 = (ON_Internal_Empty_wString *)(this->m_s + -3);
    }
    if (i < (pOVar1->header).string_length) {
      CopyArray(this);
      if (c < '\0') {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_wstring.cpp"
                   ,0xa2a,"","c is not a valid single byte utf-8 value.");
      }
      this->m_s[(uint)i] = (int)c;
    }
  }
  return;
}

Assistant:

void ON_wString::SetAt( int i, char c )
{
  if ( i >= 0 && i < Header()->string_length ) {
	  CopyArray();
    if (c < 0 || c > 127)
    {
      ON_ERROR("c is not a valid single byte utf-8 value.");
    }
	  m_s[i] = (wchar_t)c;
  }
}